

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_sortaddrinfo.c
# Opt level: O0

int rfc6724_compare(void *ptr1,void *ptr2)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  sockaddr_in6 *a2_dst;
  sockaddr_in6 *a2_src;
  sockaddr_in6 *a1_dst;
  sockaddr_in6 *a1_src;
  size_t prefixlen2;
  size_t prefixlen1;
  int precedence2;
  int precedence1;
  int label_match2;
  int label_dst2;
  int label_src2;
  int label_match1;
  int label_dst1;
  int label_src1;
  int scope_match2;
  int scope_dst2;
  int scope_src2;
  int scope_match1;
  int scope_dst1;
  int scope_src1;
  addrinfo_sort_elem *a2;
  addrinfo_sort_elem *a1;
  void *ptr2_local;
  void *ptr1_local;
  
  if (*(int *)((long)ptr1 + 8) == *(int *)((long)ptr2 + 8)) {
    scope_match1 = 1;
    if (*(int *)((long)ptr1 + 8) != 0) {
      scope_match1 = get_scope((sockaddr *)((long)ptr1 + 0xc));
    }
    iVar2 = get_scope(*(sockaddr **)(*ptr1 + 0x18));
    scope_match2 = 1;
    if (*(int *)((long)ptr2 + 8) != 0) {
      scope_match2 = get_scope((sockaddr *)((long)ptr2 + 0xc));
    }
    iVar3 = get_scope(*(sockaddr **)(*ptr2 + 0x18));
    if ((uint)(scope_match1 == iVar2) == (uint)(scope_match2 == iVar3)) {
      label_match1 = 1;
      if (*(int *)((long)ptr1 + 8) != 0) {
        label_match1 = get_label((sockaddr *)((long)ptr1 + 0xc));
      }
      iVar4 = get_label(*(sockaddr **)(*ptr1 + 0x18));
      label_match2 = 1;
      if (*(int *)((long)ptr2 + 8) != 0) {
        label_match2 = get_label((sockaddr *)((long)ptr2 + 0xc));
      }
      iVar5 = get_label(*(sockaddr **)(*ptr2 + 0x18));
      if ((uint)(label_match1 == iVar4) == (uint)(label_match2 == iVar5)) {
        iVar4 = get_precedence(*(sockaddr **)(*ptr1 + 0x18));
        iVar5 = get_precedence(*(sockaddr **)(*ptr2 + 0x18));
        if (iVar4 == iVar5) {
          if (iVar2 == iVar3) {
            if ((((*(int *)((long)ptr1 + 8) != 0) && (**(short **)(*ptr1 + 0x18) == 10)) &&
                (*(int *)((long)ptr2 + 8) != 0)) && (**(short **)(*ptr2 + 0x18) == 10)) {
              lVar1 = *(long *)(*ptr2 + 0x18);
              sVar6 = common_prefix_len((in6_addr *)((long)ptr1 + 0x14),
                                        (in6_addr *)(*(long *)(*ptr1 + 0x18) + 8));
              sVar7 = common_prefix_len((in6_addr *)((long)ptr2 + 0x14),(in6_addr *)(lVar1 + 8));
              if (sVar6 != sVar7) {
                return (int)sVar7 - (int)sVar6;
              }
            }
            ptr1_local._4_4_ =
                 (int)*(undefined8 *)((long)ptr1 + 0x28) - (int)*(undefined8 *)((long)ptr2 + 0x28);
          }
          else {
            ptr1_local._4_4_ = iVar2 - iVar3;
          }
        }
        else {
          ptr1_local._4_4_ = iVar5 - iVar4;
        }
      }
      else {
        ptr1_local._4_4_ = (uint)(label_match2 == iVar5) - (uint)(label_match1 == iVar4);
      }
    }
    else {
      ptr1_local._4_4_ = (uint)(scope_match2 == iVar3) - (uint)(scope_match1 == iVar2);
    }
  }
  else {
    ptr1_local._4_4_ = *(int *)((long)ptr2 + 8) - *(int *)((long)ptr1 + 8);
  }
  return ptr1_local._4_4_;
}

Assistant:

static int rfc6724_compare(const void *ptr1, const void *ptr2)
{
  const struct addrinfo_sort_elem *a1 = (const struct addrinfo_sort_elem *)ptr1;
  const struct addrinfo_sort_elem *a2 = (const struct addrinfo_sort_elem *)ptr2;
  int                              scope_src1;
  int                              scope_dst1;
  int                              scope_match1;
  int                              scope_src2;
  int                              scope_dst2;
  int                              scope_match2;
  int                              label_src1;
  int                              label_dst1;
  int                              label_match1;
  int                              label_src2;
  int                              label_dst2;
  int                              label_match2;
  int                              precedence1;
  int                              precedence2;
  size_t                           prefixlen1;
  size_t                           prefixlen2;

  /* Rule 1: Avoid unusable destinations. */
  if (a1->has_src_addr != a2->has_src_addr) {
    return ((int)a2->has_src_addr) - ((int)a1->has_src_addr);
  }

  /* Rule 2: Prefer matching scope. */
  scope_src1 = ARES_IPV6_ADDR_SCOPE_NODELOCAL;
  if (a1->has_src_addr) {
    scope_src1 = get_scope(&a1->src_addr.sa);
  }
  scope_dst1   = get_scope(a1->ai->ai_addr);
  scope_match1 = (scope_src1 == scope_dst1);

  scope_src2 = ARES_IPV6_ADDR_SCOPE_NODELOCAL;
  if (a2->has_src_addr) {
    scope_src2 = get_scope(&a2->src_addr.sa);
  }
  scope_dst2   = get_scope(a2->ai->ai_addr);
  scope_match2 = (scope_src2 == scope_dst2);

  if (scope_match1 != scope_match2) {
    return scope_match2 - scope_match1;
  }

  /* Rule 3: Avoid deprecated addresses.  */

  /* Rule 4: Prefer home addresses.  */

  /* Rule 5: Prefer matching label. */
  label_src1 = 1;
  if (a1->has_src_addr) {
    label_src1 = get_label(&a1->src_addr.sa);
  }
  label_dst1   = get_label(a1->ai->ai_addr);
  label_match1 = (label_src1 == label_dst1);

  label_src2 = 1;
  if (a2->has_src_addr) {
    label_src2 = get_label(&a2->src_addr.sa);
  }
  label_dst2   = get_label(a2->ai->ai_addr);
  label_match2 = (label_src2 == label_dst2);

  if (label_match1 != label_match2) {
    return label_match2 - label_match1;
  }

  /* Rule 6: Prefer higher precedence. */
  precedence1 = get_precedence(a1->ai->ai_addr);
  precedence2 = get_precedence(a2->ai->ai_addr);
  if (precedence1 != precedence2) {
    return precedence2 - precedence1;
  }

  /* Rule 7: Prefer native transport.  */

  /* Rule 8: Prefer smaller scope. */
  if (scope_dst1 != scope_dst2) {
    return scope_dst1 - scope_dst2;
  }

  /* Rule 9: Use longest matching prefix. */
  if (a1->has_src_addr && a1->ai->ai_addr->sa_family == AF_INET6 &&
      a2->has_src_addr && a2->ai->ai_addr->sa_family == AF_INET6) {
    const struct sockaddr_in6 *a1_src = &a1->src_addr.sa6;
    const struct sockaddr_in6 *a1_dst =
      CARES_INADDR_CAST(const struct sockaddr_in6 *, a1->ai->ai_addr);
    const struct sockaddr_in6 *a2_src = &a2->src_addr.sa6;
    const struct sockaddr_in6 *a2_dst =
      CARES_INADDR_CAST(const struct sockaddr_in6 *, a2->ai->ai_addr);
    prefixlen1 = common_prefix_len(&a1_src->sin6_addr, &a1_dst->sin6_addr);
    prefixlen2 = common_prefix_len(&a2_src->sin6_addr, &a2_dst->sin6_addr);
    if (prefixlen1 != prefixlen2) {
      return (int)prefixlen2 - (int)prefixlen1;
    }
  }

  /*
   * Rule 10: Leave the order unchanged.
   * We need this since qsort() is not necessarily stable.
   */
  return ((int)a1->original_order) - ((int)a2->original_order);
}